

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedCols(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int *perm)

{
  bool bVar1;
  int iVar2;
  Representation RVar3;
  Status *pSVar4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  int n;
  int i;
  Status in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  Status in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  SPxStatus stat;
  undefined4 in_stack_ffffffffffffffd0;
  Status in_stack_ffffffffffffffd4;
  uint local_14;
  
  iVar2 = Desc::nCols((Desc *)0x6a6624);
  RVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rep(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_RDI + 8));
  if (RVar3 == COLUMN) {
    for (local_14 = 0; (int)local_14 < iVar2; local_14 = local_14 + 1) {
      if ((int)(in_RSI->nonzeroFactor).m_backend.data._M_elems[(long)(int)local_14 + -0x16] < 0) {
        Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
        bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
        if (bVar1) {
          setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (SPxStatus)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        }
      }
      else {
        pSVar4 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffbc);
        in_stack_ffffffffffffffd4 = *pSVar4;
        pSVar4 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffbc);
        *pSVar4 = in_stack_ffffffffffffffd4;
      }
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0x40) = 0;
    *(undefined1 *)(in_RDI + 0x50) = 0;
    for (local_14 = 0; (int)local_14 < iVar2; local_14 = local_14 + 1) {
      if ((in_RSI->nonzeroFactor).m_backend.data._M_elems[(long)(int)local_14 + -0x16] != local_14)
      {
        if ((int)(in_RSI->nonzeroFactor).m_backend.data._M_elems[(long)(int)local_14 + -0x16] < 0) {
          stat = (SPxStatus)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
          Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
          bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
          if (!bVar1) {
            setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),stat);
          }
        }
        else {
          pSVar4 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                   in_stack_ffffffffffffffbc);
          in_stack_ffffffffffffffc4 = *pSVar4;
          pSVar4 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                   in_stack_ffffffffffffffbc);
          *pSVar4 = in_stack_ffffffffffffffc4;
        }
      }
    }
  }
  reDim(in_RSI);
  return;
}

Assistant:

void SPxBasisBase<R>::removedCols(const int perm[])
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   int i;
   int n = thedesc.nCols();

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      for(i = 0; i < n; ++i)
      {
         if(perm[i] < 0)            // column got removed
         {
            if(theLP->isBasic(thedesc.colStatus(i)))
               setStatus(NO_PROBLEM);
         }
         else                        // column was potentially moved
            thedesc.colStatus(perm[i]) = thedesc.colStatus(i);
      }
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);
      factorized = matrixIsSetup = false;

      for(i = 0; i < n; ++i)
      {
         if(perm[i] != i)
         {
            if(perm[i] < 0)                // column got removed
            {
               if(!theLP->isBasic(thedesc.colStatus(i)))
                  setStatus(NO_PROBLEM);
            }
            else                            // column was moved
               thedesc.colStatus(perm[i]) = thedesc.colStatus(i);
         }
      }
   }

   reDim();
}